

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::find_library_name_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_program *program)

{
  allocator local_11a;
  allocator local_119;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"dart",(allocator *)&local_118);
  t_program::get_namespace(__return_storage_ptr__,program,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::string((string *)&local_58,(string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_78,".",&local_119);
  std::__cxx11::string::string((string *)&local_98,"_",&local_11a);
  replace_all(&local_118,this,&local_58,&local_78,&local_98);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_b8,(string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_d8,"-",&local_119);
  std::__cxx11::string::string((string *)&local_f8,"_",&local_11a);
  replace_all(&local_118,this,&local_b8,&local_d8,&local_f8);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::find_library_name(t_program* program) {
  string name = program->get_namespace("dart");
  if (name.empty()) {
    name = program->get_name();
  }
  name = replace_all(name, ".", "_");
  name = replace_all(name, "-", "_");
  return name;
}